

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O3

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  idx_t *__k;
  idx_t *__k_00;
  data_t dVar1;
  idx_t iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  CSVBufferHandle *pCVar5;
  bool bVar6;
  idx_t iVar7;
  size_type *psVar8;
  undefined3 in_register_00000081;
  ulong uVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  optional_ptr<duckdb::FileBuffer,_true> *poVar12;
  string local_70;
  size_type *local_50;
  bool *local_48;
  data_ptr_t local_40;
  idx_t *local_38;
  
  if (CONCAT31(in_register_00000081,reconstruct_line) == 0) {
LAB_014f7a3d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_48 = first_char_nl;
  if ((this->begin).buffer_pos == (this->end).buffer_pos) {
    iVar2 = (this->begin).buffer_idx;
    iVar7 = (this->end).buffer_idx;
    if (iVar2 != iVar7) goto LAB_014f7a5d;
    if ((this->begin).buffer_size == (this->end).buffer_size) goto LAB_014f7a3d;
LAB_014f7bcd:
    local_50 = &local_70._M_string_length;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_string_length = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&buffer_handles->_M_h,&(this->end).buffer_idx);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
        ._M_cur == (__node_type *)0x0) {
LAB_014f7c85:
      paVar11 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
      psVar8 = &__return_storage_ptr__->_M_string_length;
      goto LAB_014f7caa;
    }
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,&(this->begin).buffer_idx);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    poVar12 = &(pCVar5->handle).node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar12);
    iVar2 = (this->begin).buffer_pos;
    dVar1 = poVar12->ptr->buffer[iVar2];
    bVar6 = dVar1 == '\r' || dVar1 == '\n';
    *local_48 = bVar6;
    uVar10 = bVar6 + iVar2;
    if (uVar10 < (this->end).buffer_pos) {
      do {
        ::std::__cxx11::string::push_back((char)&local_70);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (this->end).buffer_pos);
    }
  }
  else {
    iVar2 = (this->begin).buffer_idx;
    iVar7 = (this->end).buffer_idx;
LAB_014f7a5d:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50 = &local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    __k = &(this->end).buffer_idx;
    __k_00 = &(this->begin).buffer_idx;
    if (iVar7 == iVar2) goto LAB_014f7bcd;
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&buffer_handles->_M_h,__k_00);
    if ((iVar3.
         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (iVar3 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&buffer_handles->_M_h,__k),
       iVar3.
       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_false>
       ._M_cur == (__node_type *)0x0)) goto LAB_014f7c85;
    local_38 = __k;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k_00);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    poVar12 = &(pCVar5->handle).node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar12);
    local_40 = poVar12->ptr->buffer;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,__k_00);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    uVar10 = pCVar5->actual_size;
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)buffer_handles,local_38);
    pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar4);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar5->handle).node);
    iVar2 = (this->begin).buffer_pos;
    bVar6 = local_40[iVar2] == '\r' || local_40[iVar2] == '\n';
    *local_48 = bVar6;
    uVar9 = bVar6 + iVar2;
    if (uVar9 < uVar10) {
      do {
        ::std::__cxx11::string::push_back((char)&local_70);
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar10);
    }
    if ((this->end).buffer_pos != 0) {
      uVar10 = 0;
      do {
        ::std::__cxx11::string::push_back((char)&local_70);
        uVar10 = uVar10 + 1;
      } while (uVar10 < (this->end).buffer_pos);
    }
  }
  paVar11 = &local_70.field_2;
  SanitizeError(&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar11) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_70._M_string_length;
  psVar8 = local_50;
  local_70._M_dataplus._M_p = (pointer)paVar11;
LAB_014f7caa:
  *psVar8 = 0;
  paVar11->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}